

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O1

size_t svb_decode(uint32_t *out,uint8_t *in,int delta,int type)

{
  uint count;
  uint8_t *puVar1;
  size_t sVar2;
  ulong count_00;
  uint8_t *keyPtr;
  
  count = *(uint *)in;
  count_00 = (ulong)count;
  if (count_00 == 0) {
    sVar2 = 0;
  }
  else {
    keyPtr = in + 4;
    puVar1 = in + (ulong)(count + 3 >> 2) + 4;
    if (delta == 0 && (type ^ 1U) == 0) {
      puVar1 = svb_decode_scalar(out,keyPtr,puVar1,count);
    }
    else if (delta == 1 && (type ^ 1U) == 0) {
      puVar1 = svb_decode_scalar_d1_init(out,keyPtr,puVar1,count,0);
    }
    else if (type == 5 && delta == 0) {
      puVar1 = svb_decode_avx_simple(out,keyPtr,puVar1,count_00);
    }
    else {
      if ((delta != 1) || (type != 5)) {
        printf("Unknown delta (%d) type (%d) combination.\n",(ulong)(uint)delta,type);
        abort();
      }
      puVar1 = svb_decode_avx_d1_init(out,keyPtr,puVar1,count_00,0);
    }
    sVar2 = (long)puVar1 - (long)in;
  }
  return sVar2;
}

Assistant:

size_t svb_decode(uint32_t *out, uint8_t *in, int delta, int type) {
  uint32_t count = *(uint32_t *)in; // first 4 bytes is number of ints
  if (count == 0)
    return 0;

  uint8_t *keyPtr = in + 4;            // full list of keys is next
  uint32_t keyLen = ((count + 3) / 4); // 2-bits per key (rounded up)
  uint8_t *dataPtr = keyPtr + keyLen;  // data starts at end of keys

  if (delta == 0 && type == 1) {
    return svb_decode_scalar(out, keyPtr, dataPtr, count) - in;
  }

  if (delta == 1 && type == 1) {
    return svb_decode_scalar_d1(out, keyPtr, dataPtr, count) - in;
  }

  if (delta == 0 && type == 5) {
    return svb_decode_avx_simple(out, keyPtr, dataPtr, count) - in;
  }

  if (delta == 1 && type == 5) {
    return svb_decode_avx_d1_simple(out, keyPtr, dataPtr, count) - in;
  }

  printf("Unknown delta (%d) type (%d) combination.\n", delta, type);
  abort();
}